

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O0

int __thiscall banksia::ChessBoard::findKing(ChessBoard *this,Side side)

{
  bool bVar1;
  size_type sVar2;
  int in_ESI;
  BoardCore *in_RDI;
  int pos;
  PieceType PVar3;
  PieceType type;
  BoardCore *this_00;
  
  PVar3 = empty;
  this_00 = in_RDI;
  while( true ) {
    type = PVar3;
    sVar2 = std::vector<banksia::Piece,_std::allocator<banksia::Piece>_>::size(&in_RDI->pieces);
    if ((int)sVar2 <= (int)PVar3) {
      return -1;
    }
    bVar1 = BoardCore::isPiece(this_00,in_ESI,type,(Side)((ulong)in_RDI >> 0x20));
    if (bVar1) break;
    PVar3 = type + king;
  }
  return type;
}

Assistant:

int ChessBoard::findKing(Side side) const
{
    for (int pos = 0; pos < int(pieces.size()); ++pos) {
        if (isPiece(pos, PieceType::king, side)) {
            return pos;
        }
    }
    return -1;
}